

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O3

ostream * Kernel::operator<<(ostream *out,FuncTerm *self)

{
  Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  *pCVar1;
  Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  *pCVar2;
  anon_class_16_2_d708292f f;
  anon_class_16_2_d708292f f_00;
  anon_class_8_1_ba1d6aae local_30;
  
  operator<<(out,&self->_fun);
  pCVar2 = &((self->_args)._stack)->super_PolyNfSuper;
  pCVar1 = &((self->_args)._cursor)->super_PolyNfSuper;
  if (pCVar2 != pCVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
    f.this = pCVar2;
    f.f = &local_30;
    local_30.out = out;
    Lib::CoproductImpl::
    RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
    ::operator<<((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                  *)(ulong)*(uint *)&(((PolyNfSuper *)&pCVar2->_inner)->_inner).
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                     .
                                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                 ,f);
    pCVar2 = pCVar2 + 1;
    if (pCVar2 != pCVar1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
        f_00.this = pCVar2;
        f_00.f = &local_30;
        local_30.out = out;
        Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::operator<<((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)(ulong)*(uint *)&(((PolyNfSuper *)&pCVar2->_inner)->_inner).
                                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                         .
                                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     ,f_00);
        pCVar2 = pCVar2 + 1;
      } while (pCVar2 != pCVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Kernel::FuncTerm& self) 
{ 
  out << self._fun;
  auto& stack = self._args;
  auto iter = stack.iterFifo();

  if (iter.hasNext()) {
    out << "(" << iter.next();
    while (iter.hasNext()) {
      out << ", " << iter.next();
    }
    out << ")";
  }

  return out;
}